

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O1

uint64_t SS_GenHashSeed(int index)

{
  int iVar1;
  ulong uVar2;
  long *plVar3;
  ulong uVar4;
  char cVar5;
  uint64_t y;
  uint64_t x;
  long local_18;
  uchar local_10 [8];
  
  plVar3 = &local_18;
  if (SS_seed == 0) {
    iVar1 = rand();
    SS_seed = (uint64_t)iVar1;
  }
  local_18 = (long)index + SS_seed;
  SS_mangle((uchar *)&local_18,local_10,8);
  uVar2 = 0x172a550d;
  uVar4 = 0x10;
  cVar5 = '\0';
  do {
    if ((uVar4 & 1) == 0) {
      cVar5 = *(char *)plVar3;
      plVar3 = (long *)((long)plVar3 + 1);
    }
    iVar1 = ((uint)uVar4 & 1) << 2;
    uVar2 = (long)(((int)cVar5 >> iVar1) % (0x10 << iVar1)) + uVar2 * 0x172a554f;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  return uVar2 ^ 0x46253dc2;
}

Assistant:

uint64_t SS_GenHashSeed(int index) {
	/*
	if (index == 0) {
		srand(0);
	}
	*/
	if (SS_seed == 0) {
		SS_seed = rand();
	}
	uint64_t x, y = SS_seed + index;
	SS_mangle((const unsigned char*)&y, (unsigned char*)&x, 8);
	return SS_AwareHash((uint8_t*)&y, 8, 388650253, 388650319, 1176845762);
}